

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::EndTestCase
          (BasicReporter *this,TestCaseInfo *testInfo,Totals *totals,string *stdOut,string *stdErr)

{
  ulong uVar1;
  ostream *poVar2;
  string *psVar3;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *stdErr_local;
  string *stdOut_local;
  Totals *totals_local;
  TestCaseInfo *testInfo_local;
  BasicReporter *this_local;
  
  local_30 = stdErr;
  stdErr_local = stdOut;
  stdOut_local = (string *)totals;
  totals_local = (Totals *)testInfo;
  testInfo_local = (TestCaseInfo *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    startSpansLazily(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"stdout",&local_51);
    streamVariableLengthText(this,&local_50,stdErr_local);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    startSpansLazily(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"stderr",&local_89);
    streamVariableLengthText(this,&local_88,local_30);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  if (((this->m_testSpan).emitted & 1U) != 0) {
    poVar2 = std::operator<<((this->m_config).stream,"[Finished: \'");
    psVar3 = TestCaseInfo::getName_abi_cxx11_((TestCaseInfo *)totals_local);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\' ");
    psVar3 = stdOut_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"All ",&local_b1);
    ReportCounts(this,(Totals *)psVar3,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    poVar2 = std::operator<<((this->m_config).stream,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

virtual void EndTestCase(   const TestCaseInfo& testInfo,
                                    const Totals& totals,
                                    const std::string& stdOut,
                                    const std::string& stdErr ) {
            if( !stdOut.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stdout", stdOut );
            }

            if( !stdErr.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stderr", stdErr );
            }

            if( m_testSpan.emitted ) {
                m_config.stream << "[Finished: '" << testInfo.getName() << "' ";
                ReportCounts( totals );
                m_config.stream << "]" << std::endl;
            }
        }